

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::layoutObjectCheck(TParseContext *this,TSourceLoc *loc,TSymbol *symbol)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  TQualifier *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvVar4;
  const_reference pvVar5;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TQualifier *qualifier;
  TType *type;
  TSymbol *symbol_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  TType *type_00;
  undefined4 extraout_var_00;
  
  iVar2 = (*symbol->_vptr_TSymbol[0xc])();
  type_00 = (TType *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*type_00->_vptr_TType[0xb])();
  this_00 = (TQualifier *)CONCAT44(extraout_var_00,iVar2);
  layoutTypeCheck(this,loc,type_00);
  bVar1 = TQualifier::hasAnyLocation(this_00);
  if (((bVar1) && (uVar3 = *(uint *)&this_00->field_0x8 & 0x7f, uVar3 == 5 || uVar3 == 6)) &&
     (iVar2 = (*symbol->_vptr_TSymbol[10])(), CONCAT44(extraout_var_01,iVar2) == 0)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only be used on variable declaration","location","");
  }
  if (((((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0) &&
       (((this->super_TParseContextBase).parsingBuiltins & 1U) == 0)) &&
      (((*(ulong *)&this_00->field_0x8 >> 7 & 0x1ff) == 0 &&
       ((bVar1 = TQualifier::hasLocation(this_00), !bVar1 &&
        (bVar1 = TIntermediate::getAutoMapLocations
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate),
        !bVar1)))))) && (uVar3 = *(uint *)&this_00->field_0x8 & 0x7f, uVar3 == 3 || uVar3 == 4)) {
    iVar2 = (*type_00->_vptr_TType[0xb])();
    bVar1 = TQualifier::isTaskMemory((TQualifier *)CONCAT44(extraout_var_02,iVar2));
    if (!bVar1) {
      iVar2 = (*type_00->_vptr_TType[0xb])();
      bVar1 = TQualifier::hasSpirvDecorate((TQualifier *)CONCAT44(extraout_var_03,iVar2));
      if (!bVar1) {
        iVar2 = (*type_00->_vptr_TType[7])();
        if (iVar2 == 0x10) {
          pvVar4 = &TType::getStruct(type_00)->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
          pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                   operator[](pvVar4,0);
          iVar2 = (*pvVar5->type->_vptr_TType[10])();
          bVar1 = TQualifier::hasLocation((TQualifier *)CONCAT44(extraout_var_04,iVar2));
          if (bVar1) goto LAB_0076ac00;
          pvVar4 = &TType::getStruct(type_00)->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
          pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                   operator[](pvVar4,0);
          iVar2 = (*pvVar5->type->_vptr_TType[10])();
          if ((*(ulong *)(CONCAT44(extraout_var_05,iVar2) + 8) >> 7 & 0x1ff) != 0)
          goto LAB_0076ac00;
        }
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"SPIR-V requires location for user input/output","location","");
      }
    }
  }
LAB_0076ac00:
  bVar1 = TQualifier::hasUniformLayout(this_00);
  if (((bVar1) && (uVar3 = *(uint *)&this_00->field_0x8 & 0x7f, uVar3 == 5 || uVar3 == 6)) &&
     (iVar2 = (*type_00->_vptr_TType[7])(), iVar2 != 0x10)) {
    bVar1 = TQualifier::hasMatrix(this_00);
    if (bVar1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot specify matrix layout on a variable declaration","layout","");
    }
    bVar1 = TQualifier::hasPacking(this_00);
    if (bVar1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot specify packing on a variable declaration","layout","");
    }
    bVar1 = TQualifier::hasOffset(this_00);
    if ((bVar1) && (bVar1 = TType::isAtomic(type_00), !bVar1)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot specify on a variable declaration","offset","");
    }
    bVar1 = TQualifier::hasAlign(this_00);
    if (bVar1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot specify on a variable declaration","align","");
    }
    bVar1 = TQualifier::isPushConstant(this_00);
    if (bVar1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only specify on a uniform block","push_constant","");
    }
    bVar1 = TQualifier::isShaderRecord(this_00);
    if (bVar1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only specify on a buffer block","shaderRecordNV","");
    }
    bVar1 = TQualifier::hasLocation(this_00);
    if ((bVar1) && (bVar1 = TType::isAtomic(type_00), bVar1)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot specify on atomic counter","location","");
    }
  }
  return;
}

Assistant:

void TParseContext::layoutObjectCheck(const TSourceLoc& loc, const TSymbol& symbol)
{
    const TType& type = symbol.getType();
    const TQualifier& qualifier = type.getQualifier();

    // first, cross check WRT to just the type
    layoutTypeCheck(loc, type);

    // now, any remaining error checking based on the object itself

    if (qualifier.hasAnyLocation()) {
        switch (qualifier.storage) {
        case EvqUniform:
        case EvqBuffer:
            if (symbol.getAsVariable() == nullptr)
                error(loc, "can only be used on variable declaration", "location", "");
            break;
        default:
            break;
        }
    }

    // user-variable location check, which are required for SPIR-V in/out:
    //  - variables have it directly,
    //  - blocks have it on each member (already enforced), so check first one
    if (spvVersion.spv > 0 && !parsingBuiltins && qualifier.builtIn == EbvNone &&
        !qualifier.hasLocation() && !intermediate.getAutoMapLocations()) {

        switch (qualifier.storage) {
        case EvqVaryingIn:
        case EvqVaryingOut:
            if (!type.getQualifier().isTaskMemory() && !type.getQualifier().hasSpirvDecorate() &&
                (type.getBasicType() != EbtBlock ||
                 (!(*type.getStruct())[0].type->getQualifier().hasLocation() &&
                   (*type.getStruct())[0].type->getQualifier().builtIn == EbvNone)))
                error(loc, "SPIR-V requires location for user input/output", "location", "");
            break;
        default:
            break;
        }
    }

    // Check packing and matrix
    if (qualifier.hasUniformLayout()) {
        switch (qualifier.storage) {
        case EvqUniform:
        case EvqBuffer:
            if (type.getBasicType() != EbtBlock) {
                if (qualifier.hasMatrix())
                    error(loc, "cannot specify matrix layout on a variable declaration", "layout", "");
                if (qualifier.hasPacking())
                    error(loc, "cannot specify packing on a variable declaration", "layout", "");
                // "The offset qualifier can only be used on block members of blocks..."
                if (qualifier.hasOffset() && !type.isAtomic())
                    error(loc, "cannot specify on a variable declaration", "offset", "");
                // "The align qualifier can only be used on blocks or block members..."
                if (qualifier.hasAlign())
                    error(loc, "cannot specify on a variable declaration", "align", "");
                if (qualifier.isPushConstant())
                    error(loc, "can only specify on a uniform block", "push_constant", "");
                if (qualifier.isShaderRecord())
                    error(loc, "can only specify on a buffer block", "shaderRecordNV", "");
                if (qualifier.hasLocation() && type.isAtomic())
                    error(loc, "cannot specify on atomic counter", "location", "");
            }
            break;
        default:
            // these were already filtered by layoutTypeCheck() (or its callees)
            break;
        }
    }
}